

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ReduceMaxLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducemax(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x4ec) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4ec;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    ReduceMaxLayerParams::ReduceMaxLayerParams(this_00.reducemax_);
    (this->layer_).reducemax_ = (ReduceMaxLayerParams *)this_00;
  }
  return (ReduceMaxLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceMaxLayerParams* NeuralNetworkLayer::mutable_reducemax() {
  if (!has_reducemax()) {
    clear_layer();
    set_has_reducemax();
    layer_.reducemax_ = new ::CoreML::Specification::ReduceMaxLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceMax)
  return layer_.reducemax_;
}